

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestreply.cpp
# Opt level: O3

R_conflict7 * parse_token(R_conflict7 *__return_storage_ptr__,QByteArrayView data)

{
  byte bVar1;
  R_conflict7 *pRVar2;
  R_conflict7 *pRVar3;
  storage_type *psVar4;
  R_conflict7 *pRVar5;
  
  psVar4 = data.m_data;
  pRVar5 = (R_conflict7 *)data.m_size;
  pRVar2 = (R_conflict7 *)0x0;
  pRVar3 = pRVar2;
  if (0 < (long)pRVar5) {
    do {
      bVar1 = psVar4[(long)pRVar2];
      if ((((0x3f < bVar1 - 0x21) ||
           ((0xe00000000000367dU >> ((ulong)(bVar1 - 0x21) & 0x3f) & 1) == 0)) && (bVar1 != 0x7c))
         && (((bVar1 != 0x7e && (9 < (byte)(bVar1 - 0x30))) &&
             (pRVar3 = pRVar2, 0x19 < (byte)((bVar1 & 0xdf) + 0xbf))))) break;
      pRVar2 = (R_conflict7 *)((long)&(pRVar2->token).m_size + 1);
      pRVar3 = pRVar5;
    } while (pRVar5 != pRVar2);
  }
  (__return_storage_ptr__->token).m_size = (qsizetype)pRVar3;
  (__return_storage_ptr__->token).m_data = psVar4;
  (__return_storage_ptr__->tail).m_size = (long)pRVar5 - (long)pRVar3;
  (__return_storage_ptr__->tail).m_data = psVar4 + (long)pRVar3;
  return pRVar3;
}

Assistant:

static constexpr auto parse_token(QByteArrayView data) noexcept
{
    struct R {
        QByteArrayView token, tail;
        constexpr explicit operator bool() const noexcept { return !token.isEmpty(); }
    };

    qsizetype i = 0;
    while (i < data.size() && is_tchar(data[i]))
        ++i;

    return R{data.first(i), data.sliced(i)};
}